

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

void secp256k1_fe_mul(secp256k1_fe *r,secp256k1_fe *a,secp256k1_fe *b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  ulong uVar64;
  ulong uVar65;
  secp256k1_fe *psVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  secp256k1_fe *psVar70;
  ulong unaff_RBP;
  secp256k1_ge *psVar71;
  secp256k1_ge *a_00;
  secp256k1_ge *psVar72;
  secp256k1_fe *psVar73;
  secp256k1_ge *psVar74;
  secp256k1_ge *r_00;
  secp256k1_ge *a_01;
  ulong unaff_R15;
  undefined1 auStack_178 [56];
  uint64_t uStack_140;
  uint64_t uStack_138;
  uint64_t uStack_130;
  uint64_t uStack_128;
  undefined8 uStack_120;
  int iStack_11c;
  secp256k1_fe *psStack_118;
  secp256k1_ge *psStack_110;
  code *pcStack_108;
  secp256k1_ge_storage sStack_100;
  undefined8 uStack_c0;
  secp256k1_fe *psStack_b8;
  code *pcStack_b0;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  secp256k1_ge *local_88;
  ulong local_80;
  secp256k1_fe *local_78;
  ulong local_70;
  secp256k1_fe *local_68;
  secp256k1_fe *local_60;
  ulong local_58;
  ulong local_50;
  secp256k1_fe *local_48;
  undefined1 local_40 [16];
  
  pcStack_b0 = (code *)0x14133b;
  secp256k1_fe_verify(a);
  pcStack_b0 = (code *)0x141343;
  secp256k1_fe_verify(b);
  pcStack_b0 = (code *)0x141350;
  secp256k1_fe_verify_magnitude(a,8);
  psVar71 = (secp256k1_ge *)0x8;
  pcStack_b0 = (code *)0x14135d;
  psVar73 = b;
  secp256k1_fe_verify_magnitude(b,8);
  if (r == b) {
    pcStack_b0 = (code *)0x141857;
    secp256k1_fe_mul_cold_21();
LAB_00141857:
    pcStack_b0 = (code *)0x14185c;
    secp256k1_fe_mul_cold_20();
LAB_0014185c:
    pcStack_b0 = (code *)0x141861;
    secp256k1_fe_mul_cold_19();
LAB_00141861:
    pcStack_b0 = (code *)0x141866;
    secp256k1_fe_mul_cold_18();
LAB_00141866:
    pcStack_b0 = (code *)0x14186b;
    secp256k1_fe_mul_cold_17();
LAB_0014186b:
    pcStack_b0 = (code *)0x141870;
    secp256k1_fe_mul_cold_16();
LAB_00141870:
    pcStack_b0 = (code *)0x141875;
    secp256k1_fe_mul_cold_15();
LAB_00141875:
    pcStack_b0 = (code *)0x14187a;
    secp256k1_fe_mul_cold_14();
LAB_0014187a:
    pcStack_b0 = (code *)0x14187f;
    secp256k1_fe_mul_cold_13();
LAB_0014187f:
    pcStack_b0 = (code *)0x141884;
    secp256k1_fe_mul_cold_12();
LAB_00141884:
    pcStack_b0 = (code *)0x141889;
    secp256k1_fe_mul_cold_11();
    a_00 = psVar71;
LAB_00141889:
    psVar70 = a;
    pcStack_b0 = (code *)0x14188e;
    secp256k1_fe_mul_cold_10();
    auVar56._8_8_ = unaff_RBP;
    auVar56._0_8_ = psVar73;
LAB_0014188e:
    auVar57._8_8_ = psVar70;
    auVar57._0_8_ = auVar56._8_8_;
    psVar66 = auVar56._0_8_;
    pcStack_b0 = (code *)0x141893;
    secp256k1_fe_mul_cold_9();
LAB_00141893:
    pcStack_b0 = (code *)0x141898;
    secp256k1_fe_mul_cold_8();
LAB_00141898:
    r = psVar66;
    pcStack_b0 = (code *)0x14189d;
    secp256k1_fe_mul_cold_7();
LAB_0014189d:
    pcStack_b0 = (code *)0x1418a2;
    secp256k1_fe_mul_cold_6();
LAB_001418a2:
    pcStack_b0 = (code *)0x1418a7;
    secp256k1_fe_mul_cold_5();
LAB_001418a7:
    pcStack_b0 = (code *)0x1418ac;
    secp256k1_fe_mul_cold_4();
LAB_001418ac:
    pcStack_b0 = (code *)0x1418b1;
    secp256k1_fe_mul_cold_3();
LAB_001418b1:
    pcStack_b0 = (code *)0x1418b6;
    secp256k1_fe_mul_cold_2();
  }
  else {
    if (a == b) goto LAB_00141857;
    psVar70 = (secp256k1_fe *)a->n[0];
    if ((ulong)psVar70 >> 0x38 != 0) goto LAB_0014185c;
    unaff_R15 = 0xffffffffffffff;
    uVar69 = a->n[1];
    if (0xffffffffffffff < uVar69) goto LAB_00141861;
    psVar71 = (secp256k1_ge *)a->n[2];
    if ((secp256k1_ge *)0xffffffffffffff < psVar71) goto LAB_00141866;
    uVar67 = a->n[3];
    if (0xffffffffffffff < uVar67) goto LAB_0014186b;
    local_80 = a->n[4];
    if (local_80 >> 0x34 != 0) goto LAB_00141870;
    uVar65 = b->n[0];
    if (0xffffffffffffff < uVar65) goto LAB_00141875;
    a = (secp256k1_fe *)b->n[1];
    if ((secp256k1_fe *)0xffffffffffffff < a) goto LAB_0014187a;
    uVar64 = b->n[2];
    if (0xffffffffffffff < uVar64) goto LAB_0014187f;
    psVar73 = (secp256k1_fe *)b->n[3];
    if ((secp256k1_fe *)0xffffffffffffff < psVar73) goto LAB_00141884;
    unaff_RBP = b->n[4];
    a_00 = psVar71;
    if (0xfffffffffffff < unaff_RBP) goto LAB_00141889;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = psVar73;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = psVar70;
    auVar56 = auVar1 * auVar31;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar64;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar69;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = a;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = psVar71;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar65;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar67;
    auVar1 = auVar56 + auVar2 * auVar32 + auVar4 * auVar34 + auVar3 * auVar33;
    a_00 = auVar1._8_8_;
    local_a0 = uVar64;
    local_98 = unaff_RBP;
    local_90 = uVar69;
    local_88 = psVar71;
    local_70 = uVar65;
    local_68 = a;
    local_60 = psVar73;
    local_48 = r;
    if ((ulong)a_00 >> 0x32 != 0) goto LAB_0014188e;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = unaff_RBP;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = local_80;
    local_50 = SUB168(auVar5 * auVar35,8);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = SUB168(auVar5 * auVar35,0);
    auVar1 = auVar1 + auVar6 * ZEXT816(0x1000003d10);
    local_58 = auVar1._0_8_;
    auVar1 = auVar1 >> 0x34;
    local_40._8_8_ = 0;
    local_40._0_8_ = unaff_RBP;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = psVar70;
    local_40 = local_40 * auVar36;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = psVar73;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar69;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar64;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = psVar71;
    auVar57 = auVar8 * auVar38;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = a;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar67;
    psVar66 = SUB168(auVar9 * auVar39,8);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar65;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = local_80;
    auVar56 = auVar7 * auVar37 + auVar57 + auVar10 * auVar40 + auVar9 * auVar39;
    auVar2 = local_40 + auVar56;
    a_00 = (secp256k1_ge *)(auVar2._8_8_ + auVar1._8_8_ + (ulong)CARRY8(auVar2._0_8_,auVar1._0_8_));
    local_78 = psVar70;
    if ((ulong)a_00 >> 0x33 != 0) goto LAB_00141893;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_50;
    auVar56 = auVar11 * ZEXT816(0x1000003d10000) + auVar1 + auVar56 + local_40;
    auVar1 = auVar56 >> 0x34;
    a_00 = auVar1._0_8_;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = unaff_RBP;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar69;
    local_98 = SUB168(auVar12 * auVar41,8);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = psVar73;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = psVar71;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar64;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar67;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = a;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = local_80;
    auVar2 = auVar1 + auVar13 * auVar42 + auVar15 * auVar44 + auVar14 * auVar43 + auVar12 * auVar41;
    uVar68 = auVar2._0_8_;
    auVar57._8_8_ = uVar68;
    auVar57._0_8_ = auVar1._8_8_;
    uVar64 = auVar2._8_8_;
    psVar66 = SUB168(auVar13 * auVar42,0);
    local_a0 = uVar67;
    if (0x3ffffffffffff < uVar64) goto LAB_00141898;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar65;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = psVar70;
    unaff_R15 = uVar68 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar56._6_2_ & 0xf);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = unaff_R15;
    auVar1 = auVar16 * auVar45 + auVar17 * ZEXT816(0x1000003d1);
    r->n[0] = auVar1._0_8_ & 0xfffffffffffff;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = psVar70;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = b->n[1];
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar69;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = b->n[0];
    auVar1 = auVar18 * auVar46 + (auVar1 >> 0x34) + auVar19 * auVar47;
    a_00 = auVar1._8_8_;
    if ((secp256k1_ge *)0x3ffffffffffff < a_00) goto LAB_0014189d;
    auVar58._8_8_ = uVar64 >> 0x34;
    auVar58._0_8_ = uVar68 >> 0x34 | uVar64 << 0xc;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = psVar71;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = b->n[4];
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar67;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = b->n[3];
    auVar2 = auVar20 * auVar48 + auVar58 + auVar21 * auVar49;
    unaff_R15 = auVar2._0_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_80;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = b->n[2];
    auVar2 = auVar2 + auVar22 * auVar50;
    uVar64 = auVar2._0_8_;
    auVar57._8_8_ = uVar64;
    auVar57._0_8_ = local_80;
    uVar65 = auVar2._8_8_;
    if (0x3ffffffffffff < uVar65) goto LAB_001418a2;
    unaff_R15 = 0xfffffffffffff;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar64 & 0xfffffffffffff;
    auVar1 = auVar1 + auVar23 * ZEXT816(0x1000003d10);
    r->n[1] = auVar1._0_8_ & 0xfffffffffffff;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = psVar70;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = b->n[2];
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar69;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = b->n[1];
    auVar26._8_8_ = 0;
    auVar26._0_8_ = psVar71;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = b->n[0];
    auVar1 = auVar25 * auVar52 + auVar24 * auVar51 + (auVar1 >> 0x34) + auVar26 * auVar53;
    a_00 = auVar1._8_8_;
    if ((secp256k1_ge *)0x3ffffffffffff < a_00) goto LAB_001418a7;
    uVar69 = uVar64 >> 0x34 | uVar65 << 0xc;
    auVar63._8_8_ = uVar69;
    auVar63._0_8_ = local_80;
    auVar62._8_8_ = uVar69;
    auVar62._0_8_ = local_80;
    auVar57._8_8_ = uVar69;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar67;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = b->n[4];
    auVar59._8_8_ = uVar65 >> 0x34;
    auVar59._0_8_ = uVar69;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_80;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = b->n[3];
    auVar2 = auVar27 * auVar54 + auVar59 + auVar28 * auVar55;
    uVar69 = auVar2._8_8_;
    if (0x3ffffffffffff < uVar69) goto LAB_001418ac;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = auVar2._0_8_;
    auVar1 = auVar1 + auVar29 * ZEXT816(0x1000003d10);
    auVar2 = auVar1 >> 0x34;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = auVar2._0_8_;
    r->n[2] = auVar1._0_8_ & 0xfffffffffffff;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar69;
    a_00 = auVar2._8_8_;
    auVar60._8_8_ = a_00;
    auVar60._0_8_ = local_58 & 0xfffffffffffff;
    auVar61 = auVar30 * ZEXT816(0x1000003d10000) + auVar60 + auVar61;
    uVar69 = auVar61._0_8_;
    uVar67 = auVar61._8_8_;
    auVar57 = auVar62;
    if (uVar67 >> 0x24 != 0) goto LAB_001418b1;
    unaff_R15 = uVar69 & 0xfffffffffffff;
    r->n[3] = unaff_R15;
    uVar69 = (uVar67 << 0xc | uVar69 >> 0x34) + (auVar56._0_8_ & 0xffffffffffff);
    r->n[4] = uVar69;
    auVar57 = auVar63;
    if (uVar69 >> 0x31 == 0) {
      r->magnitude = 1;
      r->normalized = 0;
      secp256k1_fe_verify(r);
      return;
    }
  }
  pcStack_b0 = secp256k1_ge_to_bytes;
  secp256k1_fe_mul_cold_1();
  pcStack_108 = (code *)0x1418d2;
  psVar71 = a_00;
  psVar74 = a_00;
  uStack_c0 = auVar57._8_8_;
  psStack_b8 = b;
  pcStack_b0 = (code *)unaff_R15;
  secp256k1_ge_verify(a_00);
  if (a_00->infinity == 0) {
    pcStack_108 = (code *)0x1418e7;
    secp256k1_ge_to_storage(&sStack_100,a_00);
    r[1].n[0] = sStack_100.y.n[2];
    r[1].n[1] = sStack_100.y.n[3];
    r->n[4] = sStack_100.y.n[0];
    r->magnitude = (undefined4)sStack_100.y.n[1];
    r->normalized = sStack_100.y.n[1]._4_4_;
    r->n[2] = sStack_100.x.n[2];
    r->n[3] = sStack_100.x.n[3];
    r->n[0] = sStack_100.x.n[0];
    r->n[1] = sStack_100.x.n[1];
    return;
  }
  pcStack_108 = secp256k1_ge_to_storage;
  secp256k1_ge_to_bytes_cold_1();
  a_01 = (secp256k1_ge *)auStack_178;
  psVar72 = psVar71;
  r_00 = psVar71;
  psStack_118 = r;
  psStack_110 = a_00;
  pcStack_108 = (code *)unaff_R15;
  secp256k1_ge_verify(psVar71);
  if (psVar71->infinity == 0) {
    auStack_178._48_8_ = (psVar71->x).n[0];
    uStack_140 = (psVar71->x).n[1];
    uStack_138 = (psVar71->x).n[2];
    uStack_130 = (psVar71->x).n[3];
    uStack_128 = (psVar71->x).n[4];
    uStack_120._0_4_ = (psVar71->x).magnitude;
    iStack_11c = (psVar71->x).normalized;
    r_00 = (secp256k1_ge *)(auStack_178 + 0x30);
    secp256k1_fe_normalize((secp256k1_fe *)r_00);
    auStack_178._0_8_ = (psVar71->y).n[0];
    auStack_178._8_8_ = (psVar71->y).n[1];
    auStack_178._16_8_ = (psVar71->y).n[2];
    auStack_178._24_8_ = (psVar71->y).n[3];
    auStack_178._32_8_ = (psVar71->y).n[4];
    auStack_178._40_4_ = (psVar71->y).magnitude;
    auStack_178._44_4_ = (psVar71->y).normalized;
    secp256k1_fe_normalize((secp256k1_fe *)auStack_178);
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    if (iStack_11c != 0) {
      (psVar74->x).n[0] = uStack_140 << 0x34 | auStack_178._48_8_;
      (psVar74->x).n[1] = uStack_138 << 0x28 | uStack_140 >> 0xc;
      (psVar74->x).n[2] = uStack_130 << 0x1c | uStack_138 >> 0x18;
      (psVar74->x).n[3] = uStack_128 << 0x10 | uStack_130 >> 0x24;
      secp256k1_fe_verify((secp256k1_fe *)auStack_178);
      if (auStack_178._44_4_ != 0) {
        (psVar74->x).n[4] = auStack_178._8_8_ << 0x34 | auStack_178._0_8_;
        uVar69 = auStack_178._16_8_ << 0x28 | (ulong)auStack_178._8_8_ >> 0xc;
        (psVar74->x).magnitude = (int)uVar69;
        (psVar74->x).normalized = (int)(uVar69 >> 0x20);
        (psVar74->y).n[0] = auStack_178._24_8_ << 0x1c | (ulong)auStack_178._16_8_ >> 0x18;
        (psVar74->y).n[1] = auStack_178._32_8_ << 0x10 | (ulong)auStack_178._24_8_ >> 0x24;
        return;
      }
      goto LAB_00141a6a;
    }
  }
  else {
    secp256k1_ge_to_storage_cold_1();
  }
  a_01 = r_00;
  secp256k1_ge_to_storage_cold_3();
LAB_00141a6a:
  secp256k1_ge_to_storage_cold_2();
  (a_01->x).n[0] = (psVar72->x).n[0] & 0xfffffffffffff;
  (a_01->x).n[1] = ((psVar72->x).n[1] & 0xffffffffff) << 0xc | (psVar72->x).n[0] >> 0x34;
  (a_01->x).n[2] = ((psVar72->x).n[2] & 0xfffffff) << 0x18 | (psVar72->x).n[1] >> 0x28;
  (a_01->x).n[3] = ((psVar72->x).n[3] & 0xffff) << 0x24 | (psVar72->x).n[2] >> 0x1c;
  (a_01->x).n[4] = (psVar72->x).n[3] >> 0x10;
  (a_01->x).magnitude = 1;
  (a_01->x).normalized = 1;
  secp256k1_fe_verify(&a_01->x);
  (a_01->y).n[0] = (psVar72->x).n[4] & 0xfffffffffffff;
  uVar69._0_4_ = (psVar72->x).magnitude;
  uVar69._4_4_ = (psVar72->x).normalized;
  (a_01->y).n[1] = (uVar69 & 0xffffffffff) << 0xc | (psVar72->x).n[4] >> 0x34;
  uVar67._0_4_ = (psVar72->x).magnitude;
  uVar67._4_4_ = (psVar72->x).normalized;
  (a_01->y).n[2] = ((psVar72->y).n[0] & 0xfffffff) << 0x18 | uVar67 >> 0x28;
  (a_01->y).n[3] = ((psVar72->y).n[1] & 0xffff) << 0x24 | (psVar72->y).n[0] >> 0x1c;
  (a_01->y).n[4] = (psVar72->y).n[1] >> 0x10;
  (a_01->y).magnitude = 1;
  (a_01->y).normalized = 1;
  secp256k1_fe_verify(&a_01->y);
  a_01->infinity = 0;
  secp256k1_ge_verify(a_01);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_mul(secp256k1_fe *r, const secp256k1_fe *a, const secp256k1_fe * SECP256K1_RESTRICT b) {
    SECP256K1_FE_VERIFY(a);
    SECP256K1_FE_VERIFY(b);
    SECP256K1_FE_VERIFY_MAGNITUDE(a, 8);
    SECP256K1_FE_VERIFY_MAGNITUDE(b, 8);
    VERIFY_CHECK(r != b);
    VERIFY_CHECK(a != b);

    secp256k1_fe_impl_mul(r, a, b);
    r->magnitude = 1;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}